

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  size_t n_1;
  size_t res;
  long lVar2;
  int max;
  uint uVar3;
  ulong uVar4;
  size_t n;
  long lVar5;
  long lVar6;
  timeval tv;
  int arr [200];
  timeval local_348;
  uint auStack_338 [202];
  
  lVar5 = 0;
  gettimeofday(&local_348,(__timezone_ptr_t)0x0);
  srand((uint)local_348.tv_sec);
  do {
    iVar1 = rand();
    auStack_338[lVar5] = iVar1 % 0x15;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 200);
  uVar4 = 0x7fffffff;
  lVar5 = 0;
  do {
    if ((int)auStack_338[lVar5] < (int)uVar4) {
      uVar4 = (ulong)auStack_338[lVar5];
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 200);
  uVar3 = 0x80000000;
  lVar5 = 0;
  do {
    if ((int)uVar3 < (int)auStack_338[lVar5]) {
      uVar3 = auStack_338[lVar5];
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 200);
  lVar5 = 0;
  lVar2 = 0;
  do {
    lVar2 = lVar2 + (ulong)(auStack_338[lVar5] == (uint)uVar4);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 200);
  lVar6 = 0;
  printf("The minimum is %d and it occurs %zu times.\n",uVar4,lVar2);
  lVar5 = 0;
  do {
    lVar5 = lVar5 + (ulong)(auStack_338[lVar6] == uVar3);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 200);
  printf("The maximum is %d and it occurs %zu times.\n",(ulong)uVar3,lVar5);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  struct timeval tv;
  gettimeofday(&tv, NULL);

  int arr[ARR_LEN];
  srand((unsigned int)tv.tv_sec);
  for (size_t n = 0; n < ARR_LEN; n++) {
    arr[n] = rand() % 21;
  }

  int min = minimum(arr, ARR_LEN);
  int max = maximum(arr, ARR_LEN);
  printf("The minimum is %d and it occurs %zu times.\n", min, n_occurences(arr, ARR_LEN, min));
  printf("The maximum is %d and it occurs %zu times.\n", max, n_occurences(arr, ARR_LEN, max));

  return 0;
}